

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

bool __thiscall Assimp::IFC::Curve::ReverseEval(Curve *this,IfcVector3 *val,IfcFloat *paramOut)

{
  IfcFloat a;
  IfcFloat IVar1;
  IfcFloat in_XMM1_Qa;
  
  (*this->_vptr_Curve[5])();
  IVar1 = RecursiveSearch(this,val,a,in_XMM1_Qa,0x10,9.999999747378752e-05,0,0xf);
  *paramOut = IVar1;
  return true;
}

Assistant:

bool Curve::ReverseEval(const IfcVector3& val, IfcFloat& paramOut) const
{
    // note: the following algorithm is not guaranteed to find the 'right' parameter value
    // in all possible cases, but it will always return at least some value so this function
    // will never fail in the default implementation.

    // XXX derive threshold from curve topology
    static const IfcFloat threshold = 1e-4f;
    static const unsigned int samples = 16;

    const ParamRange& range = GetParametricRange();
    paramOut = RecursiveSearch(this,val,range.first,range.second,samples,threshold);

    return true;
}